

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

wstring * __thiscall
PDA::Transducer::Identifier::contextToString_abi_cxx11_
          (wstring *__return_storage_ptr__,Identifier *this,Context cnt)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  default:
    pwVar2 = L"Default";
    pwVar1 = L"";
    break;
  case 1:
    pwVar2 = L"Declaration";
    pwVar1 = L"";
    break;
  case 2:
    pwVar2 = L"Link";
    pwVar1 = L"";
    break;
  case 3:
    pwVar2 = L"Argument";
    pwVar1 = L"";
    break;
  case 4:
    pwVar2 = L"Literal";
    pwVar1 = L"";
  }
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,pwVar2,pwVar1);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Identifier::contextToString(const Identifier::Context cnt)
{
    switch(cnt)
    {
    case Context::Default:
        return L"Default";
    case Context::Argument:
        return L"Argument";
    case Context::Link:
        return L"Link";
    case Context::Literal:
        return L"Literal";
    case Context::Declaration:
        return L"Declaration";
    }
    return L"Default";
}